

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_94(QPDF *pdf,char *arg2)

{
  byte bVar1;
  __type_conflict1 _Var2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined1 local_478 [8];
  QPDFObjectHandle p5_new_crop;
  QPDFObjectHandle p5_new_media;
  QPDFObjectHandle p5_new_bleed;
  QPDFObjectHandle local_438;
  QPDFObjectHandle local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined1 local_3d8 [8];
  QPDFObjectHandle p4_new_crop;
  QPDFObjectHandle p4_art2;
  QPDFObjectHandle p4_art1;
  QPDFObjectHandle p4_bleed2;
  QPDFObjectHandle p4_bleed1;
  QPDFObjectHandle p4_crop;
  string local_370 [32];
  QPDFObjectHandle local_350;
  undefined1 local_340 [8];
  QPDFObjectHandle p4_orig_crop;
  QPDFObjectHandle local_320;
  undefined1 local_310 [8];
  QPDFObjectHandle p3_crop;
  QPDFObjectHandle p3_media;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  QPDFObjectHandle p2_new_trim;
  QPDFObjectHandle p2_crop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  QPDFObjectHandle p1_effective_media;
  QPDFObjectHandle local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  QPDFObjectHandle p1_new_crop;
  undefined1 local_1d0 [8];
  QPDFObjectHandle p1_new_art;
  QPDFObjectHandle local_1b0;
  QPDFObjectHandle local_1a0;
  QPDFObjectHandle local_190;
  QPDFObjectHandle local_180;
  allocator<char> local_169;
  string local_168 [32];
  QPDFObjectHandle local_148;
  QPDFObjectHandle local_138;
  reference local_128;
  value_type *p5;
  value_type *p4;
  value_type *p3;
  value_type *p2;
  value_type *p1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_e0 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  undefined1 local_c8 [8];
  string root_media_unparse;
  string local_a0 [32];
  undefined1 local_80 [8];
  QPDFObjectHandle root_media;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle pages_root;
  char *arg2_local;
  QPDF *pdf_local;
  
  pages_root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/Pages",&local_59);
  QPDFObjectHandle::getKey((string *)local_28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"/MediaBox",(allocator<char> *)(root_media_unparse.field_2._M_local_buf + 0xf)
            );
  QPDFObjectHandle::getKey((string *)local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(root_media_unparse.field_2._M_local_buf + 0xf));
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&p1,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&p1);
  sVar3 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size(local_e0);
  if (sVar3 != 5) {
    __assert_fail("pages.size() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcec,"void test_94(QPDF &, const char *)");
  }
  p2 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::operator[]
                 (local_e0,0);
  p3 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::operator[]
                 (local_e0,1);
  p4 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::operator[]
                 (local_e0,2);
  p5 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::operator[]
                 (local_e0,3);
  local_128 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::operator[]
                        (local_e0,4);
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"/MediaBox",&local_169);
  QPDFObjectHandle::getKey((string *)&local_138);
  bVar1 = QPDFObjectHandle::isNull();
  if ((bVar1 & 1) == 0) {
    __assert_fail("p1.getObjectHandle().getKey(\"/MediaBox\").isNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf3,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_138);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  QPDFObjectHandle::~QPDFObjectHandle(&local_148);
  QPDFPageObjectHelper::getMediaBox(SUB81(&local_180,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_180);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p1.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf5,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_180);
  QPDFPageObjectHelper::getCropBox(SUB81(&local_190,0),SUB81(p2,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_190);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p1.getCropBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf7,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_190);
  QPDFPageObjectHelper::getBleedBox(SUB81(&local_1a0,0),SUB81(p2,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_1a0);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p1.getBleedBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf8,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_1a0);
  QPDFPageObjectHelper::getTrimBox(SUB81(&local_1b0,0),SUB81(p2,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_1b0);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p1.getTrimBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf9,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_1b0);
  QPDFPageObjectHelper::getArtBox((bool)((char)&p1_new_art + '\b'),SUB81(p2,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p1_new_art.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p1.getArtBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfa,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p1_new_art.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::getArtBox(SUB81(local_1d0,0),SUB81(p2,0));
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p1_new_crop.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
  if (!_Var2) {
    __assert_fail("p1_new_art.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfd,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string
            ((string *)
             &p1_new_crop.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_1d0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p1_new_art.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfe,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getCropBox(false,SUB81(p2,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_200);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p1_new_crop.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd01,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_200);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p1_new_crop.isSameObjectAs(p1_new_art)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd02,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&local_220,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
  if (!_Var2) {
    __assert_fail("p1_new_crop.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd03,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_220);
  QPDFPageObjectHelper::getMediaBox(SUB81(&local_230,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_230);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p1.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd05,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_230);
  QPDFPageObjectHelper::getTrimBox((bool)((char)&p1_effective_media + '\b'),SUB81(p2,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p1_effective_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p1.getTrimBox(false, false).isSameObjectAs(p1_new_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd07,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p1_effective_media.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::getMediaBox(SUB81(local_250,0));
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&local_270,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
  if (!_Var2) {
    __assert_fail("p1_effective_media.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0b,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_270);
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_250);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p1_effective_media.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0c,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getMediaBox((bool)((char)&p2_crop + '\b'));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p2_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p2.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0f,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p2_crop.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::getCropBox((bool)((char)&p2_new_trim + '\b'),SUB81(p3,0));
  QPDFPageObjectHelper::getTrimBox(SUB81(local_2a0,0),SUB81(p3,0));
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&local_2c0,&local_2e0);
  if (!_Var2) {
    __assert_fail("p2_new_trim.unparse() == p2_crop.unparse()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd12,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_2a0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p2_new_trim.isSameObjectAs(p2_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd13,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getMediaBox((bool)((char)&p3_media + '\b'));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p3_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p2.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd14,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p3_media.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::getMediaBox(false);
  QPDFPageObjectHelper::getCropBox(SUB81(local_310,0),SUB81(p4,0));
  QPDFPageObjectHelper::getMediaBox(SUB81(&local_320,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_320);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p3.getMediaBox(true).isSameObjectAs(p3_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd19,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_320);
  QPDFPageObjectHelper::getCropBox((bool)((char)&p4_orig_crop + '\b'),SUB81(p4,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p4_orig_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p3.getCropBox(true, true).isSameObjectAs(p3_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd1a,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p4_orig_crop.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"/CropBox",
             (allocator<char> *)
             ((long)&p4_crop.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_340);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&p4_crop.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_350);
  QPDFPageObjectHelper::getCropBox((bool)((char)&p4_bleed1 + '\b'),SUB81(p5,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_340);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p4_orig_crop.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd1f,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getBleedBox((bool)((char)&p4_bleed2 + '\b'),SUB81(p5,0));
  QPDFPageObjectHelper::getBleedBox((bool)((char)&p4_art1 + '\b'),SUB81(p5,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p4_bleed2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p4_bleed1.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd22,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p4_bleed2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p4_bleed1.isSameObjectAs(p4_bleed2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd23,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getArtBox((bool)((char)&p4_art2 + '\b'),SUB81(p5,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p4_art2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p4_art1.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd25,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getArtBox((bool)((char)&p4_new_crop + '\b'),SUB81(p5,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p4_new_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p4_art2.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd27,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getCropBox(SUB81(local_3d8,0),SUB81(p5,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_3d8);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p4_new_crop.isSameObjectAs(p4_orig_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd29,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isIndirect();
  if ((bVar1 & 1) == 0) {
    __assert_fail("p4_orig_crop.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2a,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isIndirect();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p4_new_crop.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2b,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparseResolved_abi_cxx11_();
  _Var2 = std::operator==(&local_3f8,&local_418);
  if (!_Var2) {
    __assert_fail("p4_new_crop.unparse() == p4_orig_crop.unparseResolved()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2c,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f8);
  QPDFPageObjectHelper::getMediaBox(SUB81(&local_428,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_428);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p5.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2f,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_428);
  QPDFPageObjectHelper::getCropBox(SUB81(&local_438,0),SUB81(local_128,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_438);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p5.getCropBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd30,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_438);
  QPDFPageObjectHelper::getBleedBox((bool)((char)&p5_new_bleed + '\b'),SUB81(local_128,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p5_new_bleed.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar1 & 1) == 0) {
    __assert_fail("p5.getBleedBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd31,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p5_new_bleed.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::getBleedBox((bool)((char)&p5_new_media + '\b'),SUB81(local_128,0));
  QPDFPageObjectHelper::getMediaBox((bool)((char)&p5_new_crop + '\b'));
  QPDFPageObjectHelper::getCropBox(SUB81(local_478,0),SUB81(local_128,0));
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p5_new_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p5_new_media.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd35,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_478);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p5_new_crop.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd36,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_478);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p5_new_crop.isSameObjectAs(p5_new_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd37,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p5_new_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p5_new_bleed.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd38,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p5_new_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p5_new_bleed.isSameObjectAs(p5_new_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd39,"void test_94(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &p5_new_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!p5_new_bleed.isSameObjectAs(p5_new_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3a,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&local_498,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
  if (!_Var2) {
    __assert_fail("p5_new_media.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3b,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_498);
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&local_4b8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
  if (!_Var2) {
    __assert_fail("p5_new_crop.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3c,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_4b8);
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&local_4d8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
  if (!_Var2) {
    __assert_fail("p5_new_bleed.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3d,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_4d8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_478);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p5_new_crop.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p5_new_media.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3d8);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p4_new_crop.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p4_art2.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p4_art1.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p4_bleed2.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p4_bleed1.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_340);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_310);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p3_crop.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2a0);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p2_new_trim.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_250);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_200);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1d0);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_e0);
  std::__cxx11::string::~string((string *)local_c8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_94(QPDF& pdf, char const* arg2)
{
    // Exercise methods to get page boxes. This test is built for
    // boxes2.pdf.

    // /MediaBox is present in the pages tree root.
    // Each page has the following boxes present directly:
    // 1. none
    // 2. crop
    // 3. media, crop
    // 4. media, crop, trim, bleed; crop is indirect
    // 5. trim, art

    auto pages_root = pdf.getRoot().getKey("/Pages");
    auto root_media = pages_root.getKey("/MediaBox");
    auto root_media_unparse = root_media.unparse();
    auto pages = QPDFPageDocumentHelper(pdf).getAllPages();
    assert(pages.size() == 5);
    auto& p1 = pages[0];
    auto& p2 = pages[1];
    auto& p3 = pages[2];
    auto& p4 = pages[3];
    auto& p5 = pages[4];

    assert(p1.getObjectHandle().getKey("/MediaBox").isNull());
    // MediaBox not present, so get inherited one
    assert(p1.getMediaBox(false).isSameObjectAs(root_media));
    // Other boxesBox not present, so fall back to MediaBox
    assert(p1.getCropBox(false, false).isSameObjectAs(root_media));
    assert(p1.getBleedBox(false, false).isSameObjectAs(root_media));
    assert(p1.getTrimBox(false, false).isSameObjectAs(root_media));
    assert(p1.getArtBox(false, false).isSameObjectAs(root_media));
    // Make copy of artbox
    auto p1_new_art = p1.getArtBox(false, true);
    assert(p1_new_art.unparse() == root_media_unparse);
    assert(!p1_new_art.isSameObjectAs(root_media));
    // This also copied cropbox
    auto p1_new_crop = p1.getCropBox(false, false);
    assert(!p1_new_crop.isSameObjectAs(root_media));
    assert(!p1_new_crop.isSameObjectAs(p1_new_art));
    assert(p1_new_crop.unparse() == root_media_unparse);
    // But it didn't copy Media
    assert(p1.getMediaBox(false).isSameObjectAs(root_media));
    // Now fall back to new crop
    assert(p1.getTrimBox(false, false).isSameObjectAs(p1_new_crop));
    // Request copy. The value returned has the same structure but is
    // a different object.
    auto p1_effective_media = p1.getMediaBox(true);
    assert(p1_effective_media.unparse() == root_media_unparse);
    assert(!p1_effective_media.isSameObjectAs(root_media));

    // copy_on_fallback didn't have to copy media to crop
    assert(p2.getMediaBox(false).isSameObjectAs(root_media));
    auto p2_crop = p2.getCropBox(false, false);
    auto p2_new_trim = p2.getTrimBox(false, true);
    assert(p2_new_trim.unparse() == p2_crop.unparse());
    assert(!p2_new_trim.isSameObjectAs(p2_crop));
    assert(p2.getMediaBox(false).isSameObjectAs(root_media));

    // We didn't need to copy anything
    auto p3_media = p3.getMediaBox(false);
    auto p3_crop = p3.getCropBox(false, false);
    assert(p3.getMediaBox(true).isSameObjectAs(p3_media));
    assert(p3.getCropBox(true, true).isSameObjectAs(p3_crop));

    // We didn't have to copy for bleed but we did for art
    auto p4_orig_crop = p4.getObjectHandle().getKey("/CropBox");
    auto p4_crop = p4.getCropBox(false, false);
    assert(p4_orig_crop.isSameObjectAs(p4_crop));
    auto p4_bleed1 = p4.getBleedBox(false, false);
    auto p4_bleed2 = p4.getBleedBox(false, true);
    assert(!p4_bleed1.isSameObjectAs(p4_crop));
    assert(p4_bleed1.isSameObjectAs(p4_bleed2));
    auto p4_art1 = p4.getArtBox(false, false);
    assert(p4_art1.isSameObjectAs(p4_crop));
    auto p4_art2 = p4.getArtBox(false, true);
    assert(!p4_art2.isSameObjectAs(p4_crop));
    auto p4_new_crop = p4.getCropBox(true, false);
    assert(!p4_new_crop.isSameObjectAs(p4_orig_crop));
    assert(p4_orig_crop.isIndirect());
    assert(!p4_new_crop.isIndirect());
    assert(p4_new_crop.unparse() == p4_orig_crop.unparseResolved());

    // Exercise copying for inheritance and fallback
    assert(p5.getMediaBox(false).isSameObjectAs(root_media));
    assert(p5.getCropBox(false, false).isSameObjectAs(root_media));
    assert(p5.getBleedBox(false, false).isSameObjectAs(root_media));
    auto p5_new_bleed = p5.getBleedBox(true, true);
    auto p5_new_media = p5.getMediaBox(false);
    auto p5_new_crop = p5.getCropBox(false, false);
    assert(!p5_new_media.isSameObjectAs(root_media));
    assert(!p5_new_crop.isSameObjectAs(root_media));
    assert(!p5_new_crop.isSameObjectAs(p5_new_media));
    assert(!p5_new_bleed.isSameObjectAs(root_media));
    assert(!p5_new_bleed.isSameObjectAs(p5_new_media));
    assert(!p5_new_bleed.isSameObjectAs(p5_new_crop));
    assert(p5_new_media.unparse() == root_media_unparse);
    assert(p5_new_crop.unparse() == root_media_unparse);
    assert(p5_new_bleed.unparse() == root_media_unparse);
}